

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsizegrip.cpp
# Opt level: O0

void QSizeGrip::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSizeGripPrivate *in_RCX;
  int in_EDX;
  int in_ESI;
  QSizeGrip *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    d_func((QSizeGrip *)0x6815cf);
    QSizeGripPrivate::_q_showIfNotHidden(in_RCX);
  }
  return;
}

Assistant:

void QSizeGrip::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSizeGrip *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_showIfNotHidden(); break;
        default: ;
        }
    }
    (void)_a;
}